

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setPlaceholderText(QComboBox *this,QString *placeholderText)

{
  QString *s2;
  long lVar1;
  bool bVar2;
  int iVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  s2 = (QString *)(lVar1 + 0x2c8);
  bVar2 = ::comparesEqual(placeholderText,s2);
  if (bVar2) {
    return;
  }
  QString::operator=(s2,(QString *)placeholderText);
  iVar3 = currentIndex(this);
  if (iVar3 != -1) {
    QWidget::updateGeometry(&this->super_QWidget);
    return;
  }
  if (*(long *)(lVar1 + 0x2d8) != 0) {
    QWidget::update(&this->super_QWidget);
    return;
  }
  setCurrentIndex(this,0);
  return;
}

Assistant:

void QComboBox::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QComboBox);
    if (placeholderText == d->placeholderText)
        return;

    d->placeholderText = placeholderText;
    if (currentIndex() == -1) {
      if (d->placeholderText.isEmpty())
        setCurrentIndex(0);
      else
        update();
    } else {
      updateGeometry();
    }
}